

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall YBBVirtualMachine::run(YBBVirtualMachine *this)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  YBBVirtualMachine *this_local;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve(&this->registers,0x2000);
LAB_00109b3e:
  uVar1 = this->instrPos;
  sVar3 = std::vector<YBBInst,_std::allocator<YBBInst>_>::size(&this->instructions);
  if (sVar3 <= uVar1) {
    return;
  }
  pvVar4 = std::vector<YBBInst,_std::allocator<YBBInst>_>::operator[]
                     (&this->instructions,(ulong)this->instrPos);
  switch(*pvVar4) {
  case JmpNext:
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->registers,(ulong)(this->ptrPos & 0x1fff));
    if (*pvVar5 == '\0') {
      pmVar6 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->jmpMap,&this->instrPos);
      this->instrPos = *pmVar6 + 1;
      goto LAB_00109b3e;
    }
    break;
  case PtrRMov:
    this->ptrPos = this->ptrPos + 1;
    break;
  case PtrAdd:
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->registers,(ulong)(this->ptrPos & 0x1fff));
    *pvVar5 = *pvVar5 + '\x01';
    break;
  case PtrPrint:
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->registers,(ulong)(this->ptrPos & 0x1fff));
    putchar((int)*pvVar5);
    break;
  case PtrInput:
    iVar2 = getchar();
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->registers,(ulong)(this->ptrPos & 0x1fff));
    *pvVar5 = (value_type)iVar2;
    break;
  case PtrSub:
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->registers,(ulong)(this->ptrPos & 0x1fff));
    *pvVar5 = *pvVar5 + -1;
    break;
  case PtrLMov:
    this->ptrPos = this->ptrPos - 1;
    break;
  case JmpFirst:
    goto switchD_00109b9a_caseD_7;
  }
  this->instrPos = this->instrPos + 1;
  goto LAB_00109b3e;
switchD_00109b9a_caseD_7:
  pmVar6 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->jmpMap,&this->instrPos);
  this->instrPos = *pmVar6;
  goto LAB_00109b3e;
}

Assistant:

void run(){
        //
        registers.reserve(STACK_SIZE);
        while (instrPos < instructions.size()){
            switch (instructions[instrPos]) {
                case PtrRMov:
                    ptrPos++;
                    break;
                case PtrLMov:
                    ptrPos--;
                    break;
                case PtrAdd:
                    registers[ptrPos & (STACK_SIZE - 1)] += 1;
                    break;
                case PtrSub:
                    registers[ptrPos & (STACK_SIZE - 1)] -= 1;
                    break;
                case PtrPrint:
                    putchar(registers[ptrPos & (STACK_SIZE - 1)]);
                    break;
                case PtrInput:
                    registers[ptrPos & (STACK_SIZE - 1)] = getchar();
                    break;
                case JmpNext:
                    if (registers[ptrPos & (STACK_SIZE - 1)] == 0) {
                        instrPos = jmpMap[instrPos] + 1;
                        continue;
                    }
                    break;
                case JmpFirst:
                    instrPos = jmpMap[instrPos];
                    continue;
            }
            instrPos++;
        }
    }